

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O0

void __thiscall tonk::Connection::tonk_close(Connection *this)

{
  ErrorResult *this_00;
  char *source;
  long in_RDI;
  Result *in_stack_ffffffffffffff50;
  ErrorType in_stack_ffffffffffffff5c;
  string *desc;
  Result *in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff94;
  RefCounter *in_stack_ffffffffffffff98;
  string local_48 [32];
  undefined8 local_28;
  undefined4 local_1c;
  undefined1 *local_18;
  char *local_10;
  string *local_8;
  
  this_00 = (ErrorResult *)(in_RDI + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff98,"Application requested session end",
             (allocator *)&stack0xffffffffffffff97);
  desc = local_48;
  local_10 = "Connection::tonk_close";
  local_18 = &stack0xffffffffffffff98;
  local_1c = 0;
  local_28 = 0xc;
  local_8 = desc;
  source = (char *)operator_new(0x38);
  ErrorResult::ErrorResult
            (this_00,source,desc,in_stack_ffffffffffffff5c,(ErrorCodeT)in_stack_ffffffffffffff50);
  *(char **)desc = source;
  RefCounter::StartShutdown
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,in_stack_ffffffffffffff88);
  Result::~Result(in_stack_ffffffffffffff50);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff97);
  return;
}

Assistant:

void Connection::tonk_close()
{
    // WARNING: This function is not called on the Connection green thread,
    // so accessing members here is not threadsafe by default.

    TONK_DEBUG_ASSERT(SelfRefCount.DoesAppHoldReference());

    // Begin disconnect if it has not happened yet
    SelfRefCount.StartShutdown(Tonk_AppRequest, Result("Connection::tonk_close", "Application requested session end", ErrorType::Tonk, Tonk_AppRequest));

    // The disconnection will complete on the timer tick green thread
}